

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void ContextBlockSplitterFinishBlock(ContextBlockSplitter *self,MemoryManager *m,int is_final)

{
  uint uVar1;
  BlockSplit *pBVar2;
  ulong uVar3;
  HistogramLiteral *pHVar4;
  size_t sVar5;
  ContextBlockSplitter *pCVar6;
  uint *puVar7;
  HistogramLiteral *pHVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  void *local_3f8;
  size_t __brotli_swap_tmp;
  size_t last_histogram_ix;
  size_t jx;
  size_t j;
  size_t curr_histo_ix;
  size_t i_2;
  double diff [2];
  double combined_entropy [26];
  HistogramLiteral *combined_histo;
  double entropy [13];
  ulong local_248;
  size_t i;
  HistogramLiteral *histograms;
  double *last_entropy;
  size_t num_contexts;
  BlockSplit *split;
  int is_final_local;
  MemoryManager *m_local;
  ContextBlockSplitter *self_local;
  size_t i_4;
  ulong local_1f0;
  size_t i_1;
  ulong local_1b8;
  size_t i_3;
  uint32_t *local_1a0;
  double retval_4;
  size_t sum_4;
  uint *local_188;
  uint32_t *local_180;
  double retval_2;
  size_t sum_2;
  HistogramLiteral *local_168;
  uint32_t *local_160;
  double retval;
  size_t sum;
  HistogramLiteral *local_148;
  ulong local_140;
  size_t p;
  uint32_t *population_end;
  double retval_1;
  size_t sum_1;
  ulong local_118;
  HistogramLiteral *local_110;
  ulong local_108;
  size_t p_1;
  uint32_t *population_end_1;
  double retval_3;
  size_t sum_3;
  ulong local_e0;
  HistogramLiteral *local_d8;
  ulong local_d0;
  size_t p_2;
  uint32_t *population_end_2;
  double retval_5;
  size_t sum_5;
  ulong local_a8;
  uint *local_a0;
  ulong local_98;
  double local_90;
  ulong local_88;
  double local_80;
  double local_78;
  double local_70;
  ulong local_68;
  double local_60;
  ulong local_58;
  double local_50;
  double local_48;
  double local_40;
  ulong local_38;
  double local_30;
  ulong local_28;
  double local_20;
  double local_18;
  double local_10;
  undefined4 uVar37;
  undefined4 uVar38;
  
  pBVar2 = self->split_;
  uVar3 = self->num_contexts_;
  pHVar4 = self->histograms_;
  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    *pBVar2->lengths = (uint32_t)self->block_size_;
    *pBVar2->types = '\0';
    for (local_248 = 0; local_248 < uVar3; local_248 = local_248 + 1) {
      local_148 = pHVar4 + local_248;
      sum = self->alphabet_size_;
      sum_1 = (size_t)&retval;
      retval_1 = 0.0;
      population_end = (uint32_t *)0x0;
      p = (size_t)(local_148->data_ + sum);
      local_118 = sum;
      local_110 = local_148;
      if ((sum & 1) == 0) goto LAB_0011fa6f;
      while( true ) {
        uVar1 = local_110->data_[0];
        local_140 = CONCAT44(0,uVar1);
        retval_1 = (double)((long)retval_1 + local_140);
        auVar15._8_4_ = 0;
        auVar15._0_8_ = local_140;
        auVar15._12_4_ = 0x45300000;
        local_38 = local_140;
        if (local_140 < 0x100) {
          local_30 = kLog2Table[local_140];
          local_110 = (HistogramLiteral *)(local_110->data_ + 1);
        }
        else {
          auVar16._8_4_ = 0;
          auVar16._0_8_ = local_140;
          auVar16._12_4_ = 0x45300000;
          local_110 = (HistogramLiteral *)(local_110->data_ + 1);
          local_30 = log2((auVar16._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_30 +
             (double)population_end);
LAB_0011fa6f:
        if (p <= local_110) break;
        uVar1 = local_110->data_[0];
        local_140 = CONCAT44(0,uVar1);
        retval_1 = (double)((long)retval_1 + local_140);
        auVar13._8_4_ = 0;
        auVar13._0_8_ = local_140;
        auVar13._12_4_ = 0x45300000;
        local_28 = local_140;
        if (local_140 < 0x100) {
          local_20 = kLog2Table[local_140];
          local_110 = (HistogramLiteral *)(local_110->data_ + 1);
        }
        else {
          auVar14._8_4_ = 0;
          auVar14._0_8_ = local_140;
          auVar14._12_4_ = 0x45300000;
          local_110 = (HistogramLiteral *)(local_110->data_ + 1);
          local_20 = log2((auVar14._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (-((auVar13._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_20 +
             (double)population_end);
      }
      if (retval_1 != 0.0) {
        uVar37 = (undefined4)((ulong)retval_1 >> 0x20);
        auVar17._8_4_ = uVar37;
        auVar17._0_8_ = retval_1;
        auVar17._12_4_ = 0x45300000;
        uVar38 = SUB84(retval_1,0);
        local_18 = retval_1;
        if ((ulong)retval_1 < 0x100) {
          local_10 = kLog2Table[(long)retval_1];
        }
        else {
          auVar18._8_4_ = uVar37;
          auVar18._0_8_ = retval_1;
          auVar18._12_4_ = 0x45300000;
          local_10 = log2((auVar18._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0));
        }
        population_end =
             (uint32_t *)
             (((auVar17._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0)) * local_10 +
             (double)population_end);
      }
      *(double *)sum_1 = retval_1;
      local_160 = population_end;
      uVar38 = (undefined4)((ulong)retval >> 0x20);
      auVar19._8_4_ = uVar38;
      auVar19._0_8_ = retval;
      auVar19._12_4_ = 0x45300000;
      if ((double)population_end <
          (auVar19._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0)) {
        auVar20._8_4_ = uVar38;
        auVar20._0_8_ = retval;
        auVar20._12_4_ = 0x45300000;
        local_160 = (uint32_t *)
                    ((auVar20._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(retval,0)) - 4503599627370496.0));
      }
      self->last_entropy_[local_248] = (double)local_160;
      self->last_entropy_[uVar3 + local_248] = self->last_entropy_[local_248];
    }
    self->num_blocks_ = self->num_blocks_ + 1;
    pBVar2->num_types = pBVar2->num_types + 1;
    self->curr_histogram_ix_ = uVar3 + self->curr_histogram_ix_;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      pHVar4 = self->histograms_;
      sVar5 = self->curr_histogram_ix_;
      uVar12 = self->num_contexts_;
      for (local_1f0 = 0; local_1f0 < uVar12; local_1f0 = local_1f0 + 1) {
        pHVar8 = pHVar4 + sVar5 + local_1f0;
        memset(pHVar8,0,0x400);
        pHVar8->total_count_ = 0;
        pHVar8->bit_cost_ = INFINITY;
      }
    }
    self->block_size_ = 0;
  }
  else if (self->block_size_ != 0) {
    if ((uVar3 & 0x7fffffffffffffff) == 0) {
      local_3f8 = (void *)0x0;
    }
    else {
      local_3f8 = BrotliAllocate(m,uVar3 * 0x820);
    }
    memset(&i_2,0,0x10);
    for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
      lVar9 = self->curr_histogram_ix_ + curr_histo_ix;
      local_168 = pHVar4 + lVar9;
      sum_2 = self->alphabet_size_;
      local_d8 = local_168;
      local_e0 = sum_2;
      sum_3 = (size_t)&retval_2;
      retval_3 = 0.0;
      population_end_1 = (uint32_t *)0x0;
      p_1 = (size_t)(local_168->data_ + sum_2);
      if ((sum_2 & 1) == 0) goto LAB_001200af;
      while( true ) {
        pHVar8 = local_d8;
        local_d8 = (HistogramLiteral *)(local_d8->data_ + 1);
        uVar1 = pHVar8->data_[0];
        local_108 = CONCAT44(0,uVar1);
        retval_3 = (double)((long)retval_3 + local_108);
        auVar23._8_4_ = 0;
        auVar23._0_8_ = local_108;
        auVar23._12_4_ = 0x45300000;
        local_68 = local_108;
        if (local_108 < 0x100) {
          local_60 = kLog2Table[local_108];
        }
        else {
          auVar24._8_4_ = 0;
          auVar24._0_8_ = local_108;
          auVar24._12_4_ = 0x45300000;
          local_60 = log2((auVar24._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end_1 =
             (uint32_t *)
             (-((auVar23._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_60 +
             (double)population_end_1);
LAB_001200af:
        if (p_1 <= local_d8) break;
        uVar1 = local_d8->data_[0];
        local_108 = CONCAT44(0,uVar1);
        retval_3 = (double)((long)retval_3 + local_108);
        auVar21._8_4_ = 0;
        auVar21._0_8_ = local_108;
        auVar21._12_4_ = 0x45300000;
        local_58 = local_108;
        if (local_108 < 0x100) {
          local_50 = kLog2Table[local_108];
          local_d8 = (HistogramLiteral *)(local_d8->data_ + 1);
        }
        else {
          auVar22._8_4_ = 0;
          auVar22._0_8_ = local_108;
          auVar22._12_4_ = 0x45300000;
          local_d8 = (HistogramLiteral *)(local_d8->data_ + 1);
          local_50 = log2((auVar22._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
        }
        population_end_1 =
             (uint32_t *)
             (-((auVar21._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_50 +
             (double)population_end_1);
      }
      if (retval_3 != 0.0) {
        uVar37 = (undefined4)((ulong)retval_3 >> 0x20);
        auVar25._8_4_ = uVar37;
        auVar25._0_8_ = retval_3;
        auVar25._12_4_ = 0x45300000;
        uVar38 = SUB84(retval_3,0);
        local_48 = retval_3;
        if ((ulong)retval_3 < 0x100) {
          local_40 = kLog2Table[(long)retval_3];
        }
        else {
          auVar26._8_4_ = uVar37;
          auVar26._0_8_ = retval_3;
          auVar26._12_4_ = 0x45300000;
          local_40 = log2((auVar26._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0));
        }
        population_end_1 =
             (uint32_t *)
             (((auVar25._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0)) * local_40 +
             (double)population_end_1);
      }
      *(double *)sum_3 = retval_3;
      local_180 = population_end_1;
      uVar38 = (undefined4)((ulong)retval_2 >> 0x20);
      auVar27._8_4_ = uVar38;
      auVar27._0_8_ = retval_2;
      auVar27._12_4_ = 0x45300000;
      if ((double)population_end_1 <
          (auVar27._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,SUB84(retval_2,0)) - 4503599627370496.0)) {
        auVar28._8_4_ = uVar38;
        auVar28._0_8_ = retval_2;
        auVar28._12_4_ = 0x45300000;
        local_180 = (uint32_t *)
                    ((auVar28._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,SUB84(retval_2,0)) - 4503599627370496.0));
      }
      entropy[curr_histo_ix - 1] = (double)local_180;
      for (jx = 0; jx < 2; jx = jx + 1) {
        lVar10 = jx * uVar3 + curr_histo_ix;
        lVar11 = self->last_histogram_ix_[jx] + curr_histo_ix;
        memcpy((void *)((long)local_3f8 + lVar10 * 0x410),pHVar4 + lVar9,0x410);
        *(size_t *)((long)local_3f8 + lVar10 * 0x410 + 0x400) =
             pHVar4[lVar11].total_count_ + *(long *)((long)local_3f8 + lVar10 * 0x410 + 0x400);
        for (local_1b8 = 0; local_1b8 < 0x100; local_1b8 = local_1b8 + 1) {
          *(uint32_t *)((long)local_3f8 + local_1b8 * 4 + lVar10 * 0x410) =
               pHVar4[lVar11].data_[local_1b8] +
               *(int *)((long)local_3f8 + local_1b8 * 4 + lVar10 * 0x410);
        }
        local_188 = (uint *)((long)local_3f8 + lVar10 * 0x410);
        sum_4 = self->alphabet_size_;
        local_a0 = local_188;
        local_a8 = sum_4;
        sum_5 = (size_t)&retval_4;
        retval_5 = 0.0;
        population_end_2 = (uint32_t *)0x0;
        p_2 = (size_t)(local_188 + sum_4);
        if ((sum_4 & 1) == 0) goto LAB_00120607;
        while( true ) {
          puVar7 = local_a0;
          local_a0 = local_a0 + 1;
          uVar1 = *puVar7;
          local_d0 = CONCAT44(0,uVar1);
          retval_5 = (double)((long)retval_5 + local_d0);
          auVar31._8_4_ = 0;
          auVar31._0_8_ = local_d0;
          auVar31._12_4_ = 0x45300000;
          local_98 = local_d0;
          if (local_d0 < 0x100) {
            local_90 = kLog2Table[local_d0];
          }
          else {
            auVar32._8_4_ = 0;
            auVar32._0_8_ = local_d0;
            auVar32._12_4_ = 0x45300000;
            local_90 = log2((auVar32._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          population_end_2 =
               (uint32_t *)
               (-((auVar31._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_90 +
               (double)population_end_2);
LAB_00120607:
          if (p_2 <= local_a0) break;
          uVar1 = *local_a0;
          local_d0 = CONCAT44(0,uVar1);
          retval_5 = (double)((long)retval_5 + local_d0);
          auVar29._8_4_ = 0;
          auVar29._0_8_ = local_d0;
          auVar29._12_4_ = 0x45300000;
          local_88 = local_d0;
          if (local_d0 < 0x100) {
            local_80 = kLog2Table[local_d0];
            local_a0 = local_a0 + 1;
          }
          else {
            auVar30._8_4_ = 0;
            auVar30._0_8_ = local_d0;
            auVar30._12_4_ = 0x45300000;
            local_a0 = local_a0 + 1;
            local_80 = log2((auVar30._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0));
          }
          population_end_2 =
               (uint32_t *)
               (-((auVar29._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) * local_80 +
               (double)population_end_2);
        }
        if (retval_5 != 0.0) {
          uVar37 = (undefined4)((ulong)retval_5 >> 0x20);
          auVar33._8_4_ = uVar37;
          auVar33._0_8_ = retval_5;
          auVar33._12_4_ = 0x45300000;
          uVar38 = SUB84(retval_5,0);
          local_78 = retval_5;
          if ((ulong)retval_5 < 0x100) {
            local_70 = kLog2Table[(long)retval_5];
          }
          else {
            auVar34._8_4_ = uVar37;
            auVar34._0_8_ = retval_5;
            auVar34._12_4_ = 0x45300000;
            local_70 = log2((auVar34._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0));
          }
          population_end_2 =
               (uint32_t *)
               (((auVar33._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,uVar38) - 4503599627370496.0)) * local_70 +
               (double)population_end_2);
        }
        *(double *)sum_5 = retval_5;
        local_1a0 = population_end_2;
        uVar38 = (undefined4)((ulong)retval_4 >> 0x20);
        auVar35._8_4_ = uVar38;
        auVar35._0_8_ = retval_4;
        auVar35._12_4_ = 0x45300000;
        if ((double)population_end_2 <
            (auVar35._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,SUB84(retval_4,0)) - 4503599627370496.0)) {
          auVar36._8_4_ = uVar38;
          auVar36._0_8_ = retval_4;
          auVar36._12_4_ = 0x45300000;
          local_1a0 = (uint32_t *)
                      ((auVar36._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,SUB84(retval_4,0)) - 4503599627370496.0));
        }
        diff[lVar10 + 1] = (double)local_1a0;
        diff[jx - 1] = ((diff[lVar10 + 1] - entropy[curr_histo_ix - 1]) -
                       self->last_entropy_[lVar10]) + diff[jx - 1];
      }
    }
    if (((self->max_block_types_ <= pBVar2->num_types) ||
        ((double)i_2 < self->split_threshold_ || (double)i_2 == self->split_threshold_)) ||
       (diff[0] < self->split_threshold_ || diff[0] == self->split_threshold_)) {
      if ((double)i_2 - 20.0 <= diff[0]) {
        lVar9 = self->num_blocks_ - 1;
        pBVar2->lengths[lVar9] = (int)self->block_size_ + pBVar2->lengths[lVar9];
        for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
          memcpy(pHVar4 + self->last_histogram_ix_[0] + curr_histo_ix,
                 (void *)((long)local_3f8 + curr_histo_ix * 0x410),0x410);
          self->last_entropy_[curr_histo_ix] = diff[curr_histo_ix + 1];
          if (pBVar2->num_types == 1) {
            self->last_entropy_[uVar3 + curr_histo_ix] = self->last_entropy_[curr_histo_ix];
          }
          pHVar8 = pHVar4 + self->curr_histogram_ix_ + curr_histo_ix;
          memset(pHVar8,0,0x400);
          pHVar8->total_count_ = 0;
          pHVar8->bit_cost_ = INFINITY;
        }
        self->block_size_ = 0;
        uVar12 = self->merge_last_count_ + 1;
        self->merge_last_count_ = uVar12;
        if (1 < uVar12) {
          self->target_block_size_ = self->min_block_size_ + self->target_block_size_;
        }
      }
      else {
        pBVar2->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
        pBVar2->types[self->num_blocks_] = pBVar2->types[self->num_blocks_ - 2];
        sVar5 = self->last_histogram_ix_[0];
        self->last_histogram_ix_[0] = self->last_histogram_ix_[1];
        self->last_histogram_ix_[1] = sVar5;
        for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
          memcpy(pHVar4 + self->last_histogram_ix_[0] + curr_histo_ix,
                 (void *)((long)local_3f8 + (uVar3 + curr_histo_ix) * 0x410),0x410);
          self->last_entropy_[uVar3 + curr_histo_ix] = self->last_entropy_[curr_histo_ix];
          self->last_entropy_[curr_histo_ix] = diff[uVar3 + curr_histo_ix + 1];
          pHVar8 = pHVar4 + self->curr_histogram_ix_ + curr_histo_ix;
          memset(pHVar8,0,0x400);
          pHVar8->total_count_ = 0;
          pHVar8->bit_cost_ = INFINITY;
        }
        self->num_blocks_ = self->num_blocks_ + 1;
        self->block_size_ = 0;
        self->merge_last_count_ = 0;
        self->target_block_size_ = self->min_block_size_;
      }
    }
    else {
      pBVar2->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      pBVar2->types[self->num_blocks_] = (uint8_t)pBVar2->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = pBVar2->num_types * uVar3;
      for (curr_histo_ix = 0; curr_histo_ix < uVar3; curr_histo_ix = curr_histo_ix + 1) {
        self->last_entropy_[uVar3 + curr_histo_ix] = self->last_entropy_[curr_histo_ix];
        self->last_entropy_[curr_histo_ix] = entropy[curr_histo_ix - 1];
      }
      self->num_blocks_ = self->num_blocks_ + 1;
      pBVar2->num_types = pBVar2->num_types + 1;
      self->curr_histogram_ix_ = uVar3 + self->curr_histogram_ix_;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        pHVar4 = self->histograms_;
        sVar5 = self->curr_histogram_ix_;
        pCVar6 = (ContextBlockSplitter *)self->num_contexts_;
        for (self_local = (ContextBlockSplitter *)0x0; self_local < pCVar6;
            self_local = (ContextBlockSplitter *)((long)&self_local->alphabet_size_ + 1)) {
          pHVar8 = pHVar4 + (long)self_local->last_histogram_ix_ + (sVar5 - 0x68);
          memset(pHVar8,0,0x400);
          pHVar8->total_count_ = 0;
          pHVar8->bit_cost_ = INFINITY;
        }
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    }
    BrotliFree(m,local_3f8);
  }
  if (is_final != 0) {
    *self->histograms_size_ = pBVar2->num_types * uVar3;
    pBVar2->num_blocks = self->num_blocks_;
  }
  return;
}

Assistant:

static void ContextBlockSplitterFinishBlock(
    ContextBlockSplitter* self, MemoryManager* m, BROTLI_BOOL is_final) {
  BlockSplit* split = self->split_;
  const size_t num_contexts = self->num_contexts_;
  double* last_entropy = self->last_entropy_;
  HistogramLiteral* histograms = self->histograms_;

  if (self->block_size_ < self->min_block_size_) {
    self->block_size_ = self->min_block_size_;
  }
  if (self->num_blocks_ == 0) {
    size_t i;
    /* Create first block. */
    split->lengths[0] = (uint32_t)self->block_size_;
    split->types[0] = 0;

    for (i = 0; i < num_contexts; ++i) {
      last_entropy[i] =
          BitsEntropy(histograms[i].data_, self->alphabet_size_);
      last_entropy[num_contexts + i] = last_entropy[i];
    }
    ++self->num_blocks_;
    ++split->num_types;
    self->curr_histogram_ix_ += num_contexts;
    if (self->curr_histogram_ix_ < *self->histograms_size_) {
      ClearHistogramsLiteral(
          &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
    }
    self->block_size_ = 0;
  } else if (self->block_size_ > 0) {
    /* Try merging the set of histograms for the current block type with the
       respective set of histograms for the last and second last block types.
       Decide over the split based on the total reduction of entropy across
       all contexts. */
    double entropy[BROTLI_MAX_STATIC_CONTEXTS];
    HistogramLiteral* combined_histo =
        BROTLI_ALLOC(m, HistogramLiteral, 2 * num_contexts);
    double combined_entropy[2 * BROTLI_MAX_STATIC_CONTEXTS];
    double diff[2] = { 0.0 };
    size_t i;
    if (BROTLI_IS_OOM(m) || BROTLI_IS_NULL(combined_histo)) return;
    for (i = 0; i < num_contexts; ++i) {
      size_t curr_histo_ix = self->curr_histogram_ix_ + i;
      size_t j;
      entropy[i] = BitsEntropy(histograms[curr_histo_ix].data_,
                               self->alphabet_size_);
      for (j = 0; j < 2; ++j) {
        size_t jx = j * num_contexts + i;
        size_t last_histogram_ix = self->last_histogram_ix_[j] + i;
        combined_histo[jx] = histograms[curr_histo_ix];
        HistogramAddHistogramLiteral(&combined_histo[jx],
            &histograms[last_histogram_ix]);
        combined_entropy[jx] = BitsEntropy(
            &combined_histo[jx].data_[0], self->alphabet_size_);
        diff[j] += combined_entropy[jx] - entropy[i] - last_entropy[jx];
      }
    }

    if (split->num_types < self->max_block_types_ &&
        diff[0] > self->split_threshold_ &&
        diff[1] > self->split_threshold_) {
      /* Create new block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = (uint8_t)split->num_types;
      self->last_histogram_ix_[1] = self->last_histogram_ix_[0];
      self->last_histogram_ix_[0] = split->num_types * num_contexts;
      for (i = 0; i < num_contexts; ++i) {
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = entropy[i];
      }
      ++self->num_blocks_;
      ++split->num_types;
      self->curr_histogram_ix_ += num_contexts;
      if (self->curr_histogram_ix_ < *self->histograms_size_) {
        ClearHistogramsLiteral(
            &self->histograms_[self->curr_histogram_ix_], self->num_contexts_);
      }
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else if (diff[1] < diff[0] - 20.0) {
      /* Combine this block with second last block. */
      split->lengths[self->num_blocks_] = (uint32_t)self->block_size_;
      split->types[self->num_blocks_] = split->types[self->num_blocks_ - 2];
      BROTLI_SWAP(size_t, self->last_histogram_ix_, 0, 1);
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] =
            combined_histo[num_contexts + i];
        last_entropy[num_contexts + i] = last_entropy[i];
        last_entropy[i] = combined_entropy[num_contexts + i];
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      ++self->num_blocks_;
      self->block_size_ = 0;
      self->merge_last_count_ = 0;
      self->target_block_size_ = self->min_block_size_;
    } else {
      /* Combine this block with last block. */
      split->lengths[self->num_blocks_ - 1] += (uint32_t)self->block_size_;
      for (i = 0; i < num_contexts; ++i) {
        histograms[self->last_histogram_ix_[0] + i] = combined_histo[i];
        last_entropy[i] = combined_entropy[i];
        if (split->num_types == 1) {
          last_entropy[num_contexts + i] = last_entropy[i];
        }
        HistogramClearLiteral(&histograms[self->curr_histogram_ix_ + i]);
      }
      self->block_size_ = 0;
      if (++self->merge_last_count_ > 1) {
        self->target_block_size_ += self->min_block_size_;
      }
    }
    BROTLI_FREE(m, combined_histo);
  }
  if (is_final) {
    *self->histograms_size_ = split->num_types * num_contexts;
    split->num_blocks = self->num_blocks_;
  }
}